

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantBlock(Allocator *allocator,SynBase *source,VmBlock *block)

{
  VmType type;
  VmConstant *this;
  VmConstant *result;
  VmBlock *block_local;
  SynBase *source_local;
  Allocator *allocator_local;
  
  this = anon_unknown.dwarf_b60c8::get<VmConstant>(allocator);
  type.structType = VmType::Block.structType;
  type.type = VmType::Block.type;
  type.size = VmType::Block.size;
  VmConstant::VmConstant(this,allocator,type,source);
  this->bValue = block;
  return this;
}

Assistant:

VmConstant* CreateConstantBlock(Allocator *allocator, SynBase *source, VmBlock *block)
{
	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Block, source);

	result->bValue = block;

	return result;
}